

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void __thiscall mir::types::PtrTy::reduce_array(PtrTy *this)

{
  int iVar1;
  shared_ptr<mir::types::ArrayTy> arr;
  shared_ptr<mir::types::Ty> local_20;
  
  iVar1 = (*(((this->item).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Displayable)._vptr_Displayable[1])();
  if (iVar1 == 2) {
    std::dynamic_pointer_cast<mir::types::ArrayTy,mir::types::Ty>(&local_20);
    std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->item).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> *)
               (local_20.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1))
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_20.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  return;
}

Assistant:

void PtrTy::reduce_array() {
  if (this->item->kind() == TyKind::Array) {
    auto arr = std::dynamic_pointer_cast<ArrayTy>(this->item);
    this->item = arr->item;
  }
  // else noop
}